

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

bool Jupiter::Database::Data::process_file(Database *db)

{
  char *pcVar1;
  FILE *pFVar2;
  bool r;
  FILE *file;
  Database *db_local;
  
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&db->data_->file_name);
  pFVar2 = fopen(pcVar1,"rb");
  if (pFVar2 == (FILE *)0x0) {
    if ((db->data_->auto_create & 1U) != 0) {
      pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&db->data_->file_name);
      pFVar2 = fopen(pcVar1,"wb");
      if (pFVar2 != (FILE *)0x0) {
        (*db->_vptr_Database[2])(db,pFVar2);
        (*db->_vptr_Database[3])(db,pFVar2);
        fclose(pFVar2);
        return true;
      }
    }
    db_local._7_1_ = false;
  }
  else {
    db_local._7_1_ = Database::process_file(db,(FILE *)pFVar2);
    fclose(pFVar2);
  }
  return db_local._7_1_;
}

Assistant:

bool Jupiter::Database::Data::process_file(Jupiter::Database *db)
{
	FILE *file = fopen(db->data_->file_name.c_str(), "rb");
	if (file == nullptr)
	{
		if (db->data_->auto_create)
		{
			file = fopen(db->data_->file_name.c_str(), "wb");
			if (file != nullptr)
			{
				db->create_header(file);
				db->process_file_finish(file);
				fclose(file);
				return true;
			}
		}
		return false;
	}
	bool r = db->process_file(file);
	fclose(file);
	return r;
}